

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  char *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  iterator __position;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  iterator iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  string *psVar9;
  cmSourceGroup *this_02;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_03;
  iterator iVar10;
  _Base_ptr p_Var11;
  mapped_type *pmVar12;
  cmValue cVar13;
  cmGeneratedFileStream *pcVar14;
  ostream *poVar15;
  cmCustomCommand *pcVar16;
  long *plVar17;
  cmSourceFileLocation *pcVar18;
  cmAlphaNum *pcVar19;
  char *extraout_RDX;
  cmSourceFile *sourceFile;
  pointer ppcVar20;
  pointer __k;
  _Base_ptr __k_00;
  vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> avVar21 [8];
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  ulong uVar22;
  pointer ppcVar23;
  _Base_ptr p_Var24;
  pointer ppcVar25;
  cmGhsMultiTargetGenerator *pcVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_04;
  pointer ppcVar27;
  long lVar28;
  bool bVar29;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar30;
  string objectName;
  string gname;
  string fext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string fname_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  string lpath;
  string fpath;
  string gn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  cmSourceFile *sf;
  undefined8 in_stack_fffffffffffff8e0;
  undefined8 fout;
  undefined1 local_708 [56];
  undefined1 local_6d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8 [2];
  _Base_ptr local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  size_type local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_670;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_658;
  vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> local_638 [8];
  iterator iStack_630;
  _Alloc_hider local_628;
  undefined1 local_618 [16];
  _Alloc_hider local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5f0;
  bool local_5d0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  cmAlphaNum local_518;
  _Base_ptr local_4e0;
  _Base_ptr local_4d8;
  string local_4d0;
  string local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  code *local_468;
  undefined8 uStack_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  undefined8 local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_418;
  undefined1 *local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  undefined8 local_400;
  undefined8 *local_3f8;
  cmAlphaNum *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  undefined8 local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  cmAlphaNum *local_3b8 [2];
  undefined1 local_3a8 [32];
  char local_388 [8];
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_378;
  undefined8 local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  local_1d8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_1a8;
  undefined1 local_190 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [20];
  
  local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_698 = (_Base_ptr)fout_proj;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_5c8,&this->ConfigName);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&local_1a8,&this->Makefile->SourceGroups);
  ppcVar25 = local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_548._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_548._M_impl.super__Rb_tree_header._M_header;
  local_548._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_548._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_548._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_548._M_impl.super__Rb_tree_header._M_header._M_right =
       local_548._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar20 = local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      local_190._0_8_ = *ppcVar20;
      pcVar2 = this->Makefile;
      psVar9 = cmSourceFile::ResolveFullPath
                         ((cmSourceFile *)local_190._0_8_,(string *)0x0,(string *)0x0);
      this_02 = cmMakefile::FindSourceGroup(pcVar2,psVar9,&local_1a8);
      psVar9 = cmSourceGroup::GetFullName_abi_cxx11_(this_02);
      pcVar3 = (psVar9->_M_dataplus)._M_p;
      local_458._M_allocated_capacity = (size_type)local_448;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,pcVar3,pcVar3 + psVar9->_M_string_length);
      this_03 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1d8,(key_type *)&local_458);
      __position._M_current = *(cmSourceFile ***)(this_03 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_03 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_03,__position,(cmSourceFile **)local_190);
      }
      else {
        *__position._M_current = (cmSourceFile *)local_190._0_8_;
        *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_548,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458);
      if ((undefined1 *)local_458._M_allocated_capacity != local_448) {
        operator_delete((void *)local_458._M_allocated_capacity,local_448._0_8_ + 1);
      }
      ppcVar20 = ppcVar20 + 1;
    } while (ppcVar20 != ppcVar25);
  }
  local_458._M_allocated_capacity = (size_type)local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"CMake Rules","");
  local_438 = &local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Header Files","");
  local_418 = &local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Source Files","");
  local_3f8 = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"Object Files","");
  local_3d8 = &local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Object Libraries","");
  pcVar19 = (cmAlphaNum *)local_3a8;
  local_3b8[0] = pcVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Resources","");
  __l._M_len = 6;
  __l._M_array = (iterator)&local_458;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f0,__l,(allocator_type *)local_190);
  lVar28 = -0xc0;
  do {
    if (pcVar19 != *(cmAlphaNum **)(pcVar19[-1].Digits_ + 0x10)) {
      operator_delete(*(cmAlphaNum **)(pcVar19[-1].Digits_ + 0x10),
                      (ulong)((long)&(pcVar19->RValueString_->_M_dataplus)._M_p + 1));
    }
    pcVar19 = (cmAlphaNum *)pcVar19[-1].Digits_;
    lVar28 = lVar28 + 0x20;
  } while (lVar28 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_670,local_1d8._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)local_458._M_local_buf);
  uVar22 = 0;
  if (local_1f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __k = local_1f0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_548,__k);
      iVar8 = (int)uVar22;
      if ((_Rb_tree_header *)iVar10._M_node == &local_548._M_impl.super__Rb_tree_header) {
        if ((this->TagType == CUSTOM_TARGET) &&
           (iVar7 = std::__cxx11::string::compare((char *)__k), iVar7 == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_670,
                   ((long)local_670.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_670.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_670.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar8));
          goto LAB_003bfbee;
        }
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (local_670.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar8));
        pVar30 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&local_548,__k);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&local_548,(_Base_ptr)pVar30.first._M_node,(_Base_ptr)pVar30.second._M_node);
LAB_003bfbee:
        uVar22 = (ulong)(iVar8 + 1);
      }
      __k = __k + 1;
    } while (__k != local_1f0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    uVar22 = (ulong)(int)uVar22;
  }
  local_458._8_8_ = (pointer)0x0;
  local_448._0_8_ = local_448._0_8_ & 0xffffffffffffff00;
  local_458._M_allocated_capacity = (size_type)(cmGeneratedFileStream *)local_448;
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_548,(key_type *)&local_458);
  if ((_Rb_tree_header *)iVar10._M_node != &local_548._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (local_670.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    pVar30 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range(&local_548,(key_type *)&local_458);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&local_548,(_Base_ptr)pVar30.first._M_node,(_Base_ptr)pVar30.second._M_node);
  }
  if ((cmGeneratedFileStream *)local_458._M_allocated_capacity != (cmGeneratedFileStream *)local_448
     ) {
    operator_delete((void *)local_458._M_allocated_capacity,local_448._0_8_ + 1);
  }
  __k_00 = (_Base_ptr)
           local_670.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var24 = (_Base_ptr)
            local_670.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Rb_tree_header *)local_548._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_548._M_impl.super__Rb_tree_header) {
    lVar28 = uVar22 << 5;
    p_Var11 = local_548._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_670.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar28));
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      lVar28 = lVar28 + 0x20;
      __k_00 = (_Base_ptr)
               local_670.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var24 = (_Base_ptr)
                local_670.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((_Rb_tree_header *)p_Var11 != &local_548._M_impl.super__Rb_tree_header);
  }
  for (; __k_00 != p_Var24; __k_00 = __k_00 + 1) {
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&local_1d8,(key_type *)__k_00);
    ppcVar25 = (pmVar12->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&local_1d8,(key_type *)__k_00);
    ppcVar20 = (pmVar12->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar25 != ppcVar20) {
      uVar22 = (long)ppcVar20 - (long)ppcVar25 >> 3;
      lVar28 = 0x3f;
      if (uVar22 != 0) {
        for (; uVar22 >> lVar28 == 0; lVar28 = lVar28 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                (ppcVar25,ppcVar20,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppcVar20 - (long)ppcVar25 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar25,ppcVar20);
      }
      else {
        ppcVar23 = ppcVar25 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar25,ppcVar23);
        for (; ppcVar23 != ppcVar20; ppcVar23 = ppcVar23 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar23);
        }
      }
    }
  }
  local_638 = (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])0x0;
  iStack_630._M_current = (cmGeneratedFileStream **)0x0;
  local_628._M_p = (pointer)0x0;
  local_4e0 = (_Base_ptr)
              local_670.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  avVar21 = local_638;
  p_Var24 = (_Base_ptr)
            local_670.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar4._M_current = iStack_630._M_current;
  if (local_670.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_670.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = this->GeneratorTarget;
      local_458._M_allocated_capacity = (size_type)(cmGeneratedFileStream *)local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,"GHS_NO_SOURCE_GROUP_FILE","");
      cVar13 = cmGeneratorTarget::GetProperty(this_00,(string *)&local_458);
      if (cVar13.Value == (string *)0x0) {
        bVar5 = false;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar13.Value)->_M_dataplus)._M_p;
        bVar5 = cmValue::IsOn((cmValue *)(cVar13.Value)->_M_string_length,value);
      }
      bVar6 = true;
      if (bVar5 == false) {
        pcVar2 = this->Makefile;
        local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_568,"CMAKE_GHS_NO_SOURCE_GROUP_FILE","");
        bVar6 = cmMakefile::IsOn(pcVar2,&local_568);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
      }
      if ((cmGeneratedFileStream *)local_458._M_allocated_capacity !=
          (cmGeneratedFileStream *)local_448) {
        operator_delete((void *)local_458._M_allocated_capacity,local_448._0_8_ + 1);
      }
      fout = local_698;
      if ((bVar6 == false) && (p_Var24->_M_parent != (_Base_ptr)0x0)) {
        pcVar3 = ((_Alloc_hider *)&p_Var24->_M_color)->_M_p;
        local_6d0._0_8_ = local_6d0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6d0,pcVar3,pcVar3 + (long)p_Var24->_M_parent);
        cmsys::SystemTools::ReplaceString((string *)local_6d0,"\\","_");
        pcVar1 = cmGlobalGhsMultiGenerator::FILE_EXTENSION;
        local_458._M_allocated_capacity = local_6d0._8_8_;
        local_458._8_8_ = local_6d0._0_8_;
        local_448._0_8_ = (_func_int **)0x0;
        local_448._8_8_ = strlen(cmGlobalGhsMultiGenerator::FILE_EXTENSION);
        local_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar1;
        local_430 = 0;
        views._M_len = 2;
        views._M_array = (iterator)&local_458;
        cmCatViews((string *)&local_518,views);
        pcVar26 = this;
        psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           (&this->LocalGenerator->super_cmLocalGenerator);
        (*(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
          _vptr_cmOutputConverter[0x10])(&local_690,this->LocalGenerator,this->GeneratorTarget);
        local_458._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_458._M_allocated_capacity = psVar9->_M_string_length;
        local_448._0_8_ = (_func_int **)0x0;
        local_190._0_8_ = (cmSourceFile *)0x0;
        local_190._8_8_ = &DAT_00000001;
        local_438 = local_178;
        local_178[0]._M_local_buf[0] = '/';
        local_448._8_8_ = 1;
        local_430 = 0;
        local_428._M_allocated_capacity = local_688;
        local_428._8_8_ = (size_type)local_690;
        local_708._0_8_ = (char *)0x0;
        local_708._8_8_ = 1;
        local_708._16_8_ = local_708 + 0x18;
        local_708[0x18] = '/';
        local_410 = &DAT_00000001;
        local_400 = 0;
        local_3f8 = (undefined8 *)local_518.View_._M_len;
        local_3f0 = (cmAlphaNum *)local_518.RValueString_;
        local_3e8 = 0;
        views_00._M_len = 5;
        views_00._M_array = (iterator)&local_458;
        local_418 = &local_690;
        local_408 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_708._16_8_;
        local_190._16_8_ = local_438;
        cmCatViews(&local_4b0,views_00);
        this = pcVar26;
        if (local_690 != &local_680) {
          operator_delete(local_690,local_680._M_allocated_capacity + 1);
          this = pcVar26;
        }
        pcVar14 = (cmGeneratedFileStream *)operator_new(0x268);
        cmGeneratedFileStream::cmGeneratedFileStream(pcVar14,&local_4b0,false,None);
        local_458._M_allocated_capacity = (size_type)pcVar14;
        cmGeneratedFileStream::SetCopyIfDifferent(pcVar14,true);
        if (iStack_630._M_current == (cmGeneratedFileStream **)local_628._M_p) {
          std::vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>::
          _M_realloc_insert<cmGeneratedFileStream*const&>
                    (local_638,iStack_630,(cmGeneratedFileStream **)&local_458._M_allocated_capacity
                    );
        }
        else {
          *iStack_630._M_current = (cmGeneratedFileStream *)local_458._M_allocated_capacity;
          iStack_630._M_current = iStack_630._M_current + 1;
        }
        fout = local_458._M_allocated_capacity;
        cmGlobalGhsMultiGenerator::WriteFileHeader
                  ((cmGlobalGhsMultiGenerator *)
                   (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                   (ostream *)local_458._M_allocated_capacity);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_458._M_allocated_capacity);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_698,(char *)local_518.RValueString_,
                             local_518.View_._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_698);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p,
                          (ulong)(local_4b0.field_2._M_allocated_capacity + 1));
        }
        if (local_518.RValueString_ != (string *)&local_518.View_._M_str) {
          operator_delete(local_518.RValueString_,(ulong)(local_518.View_._M_str + 1));
        }
        if ((undefined1 *)local_6d0._0_8_ != local_6d0 + 0x10) {
          operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
        }
      }
      if (bVar6 == false) {
        if (p_Var24->_M_parent == (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)fout,"{comment} Others\n",0x11);
        }
      }
      else if (p_Var24->_M_parent == (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"{comment} Others",0x10);
        local_458._M_local_buf[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,local_458._M_local_buf,1)
        ;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"{comment} ",10);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)fout,((_Alloc_hider *)&p_Var24->_M_color)->_M_p,
                             (long)p_Var24->_M_parent);
        local_458._M_local_buf[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_458._M_local_buf,1);
      }
      iVar8 = std::__cxx11::string::compare((char *)p_Var24);
      local_4d8 = p_Var24;
      if (iVar8 == 0) {
        local_658.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_658.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_658.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = ComputeCustomCommandOrder(this,&local_658);
        ppcVar25 = local_658.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (bVar5) {
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190,"The custom commands for target [",psVar9);
          plVar17 = (long *)std::__cxx11::string::append((char *)local_190);
          pcVar14 = (cmGeneratedFileStream *)(plVar17 + 2);
          if ((cmGeneratedFileStream *)*plVar17 == pcVar14) {
            local_448._0_8_ =
                 (pcVar14->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream;
            local_448._8_8_ = plVar17[3];
            local_458._M_allocated_capacity = (size_type)(cmGeneratedFileStream *)local_448;
          }
          else {
            local_448._0_8_ =
                 (pcVar14->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream;
            local_458._M_allocated_capacity = (size_type)(cmGeneratedFileStream *)*plVar17;
          }
          local_458._8_8_ = plVar17[1];
          *plVar17 = (long)pcVar14;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
          }
          cmSystemTools::Error((string *)&local_458);
          if ((cmGeneratedFileStream *)local_458._M_allocated_capacity !=
              (cmGeneratedFileStream *)local_448) {
            operator_delete((void *)local_458._M_allocated_capacity,local_448._0_8_ + 1);
          }
        }
        else {
          for (; ppcVar25 !=
                 local_658.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish; ppcVar25 = ppcVar25 + 1) {
            pcVar18 = cmSourceFile::GetLocation(*ppcVar25);
            pcVar3 = (this->Name)._M_dataplus._M_p;
            local_458._M_allocated_capacity = (size_type)(cmGeneratedFileStream *)local_448;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_458,pcVar3,pcVar3 + (this->Name)._M_string_length);
            std::__cxx11::string::append(local_458._M_local_buf);
            pcVar3 = (pointer)(pcVar18->Name)._M_string_length;
            if (pcVar3 == (pointer)local_458._8_8_) {
              if (pcVar3 == (pointer)0x0) {
                bVar5 = true;
              }
              else {
                iVar8 = bcmp((pcVar18->Name)._M_dataplus._M_p,
                             (void *)local_458._M_allocated_capacity,(size_t)pcVar3);
                bVar5 = iVar8 == 0;
              }
            }
            else {
              bVar5 = false;
            }
            if ((cmGeneratedFileStream *)local_458._M_allocated_capacity !=
                (cmGeneratedFileStream *)local_448) {
              operator_delete((void *)local_458._M_allocated_capacity,local_448._0_8_ + 1);
            }
            if (bVar5) {
              std::_V2::
              __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                        (ppcVar25,ppcVar25 + 1,
                         local_658.
                         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              break;
            }
          }
          local_690 = &local_680;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,".sh","");
          local_618._0_8_ =
               local_658.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (local_658.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_658.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            iVar8 = 0;
            ppcVar27 = local_658.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              pcVar16 = cmSourceFile::GetCustomCommand(*ppcVar27);
              local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
              pcVar3 = (this->ConfigName)._M_dataplus._M_p;
              pcVar26 = this;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_588,pcVar3,pcVar3 + (this->ConfigName)._M_string_length);
              local_5d0 = false;
              local_478._M_allocated_capacity = 0;
              local_478._8_8_ = 0;
              local_468 = (code *)0x0;
              uStack_460 = 0;
              computeInternalDepfile.super__Function_base._M_functor._8_8_ =
                   in_stack_fffffffffffff8e0;
              computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object =
                   &local_478;
              computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)pcVar26;
              computeInternalDepfile._M_invoker = (_Invoker_type)fout;
              cmCustomCommandGenerator::cmCustomCommandGenerator
                        ((cmCustomCommandGenerator *)local_190,pcVar16,&local_588,
                         &this->LocalGenerator->super_cmLocalGenerator,true,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_5f0,computeInternalDepfile);
              if (local_468 != (code *)0x0) {
                (*local_468)(&local_478,&local_478,3);
              }
              if ((local_5d0 == true) &&
                 (local_5d0 = false,
                 local_5f0._M_value._M_dataplus._M_p !=
                 (_Alloc_hider)((long)&local_5f0._M_value + 0x10))) {
                operator_delete((void *)local_5f0._M_value._M_dataplus._M_p,local_5f0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                local_588.field_2._M_allocated_capacity + 1);
              }
              this = pcVar26;
              psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                 (&pcVar26->LocalGenerator->super_cmLocalGenerator);
              (*(pcVar26->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter.
                _vptr_cmOutputConverter[0x10])
                        (local_618 + 8,pcVar26->LocalGenerator,pcVar26->GeneratorTarget);
              pcVar18 = cmSourceFile::GetLocation(*ppcVar27);
              local_458._8_8_ = (psVar9->_M_dataplus)._M_p;
              local_458._M_allocated_capacity = psVar9->_M_string_length;
              local_448._0_8_ = (_func_int **)0x0;
              local_708._0_8_ = (char *)0x0;
              local_708._8_8_ = 1;
              local_708._16_8_ = local_708 + 0x18;
              local_708[0x18] = '/';
              local_448._8_8_ = 1;
              local_430 = 0;
              local_428._M_allocated_capacity = (size_type)local_608._M_p;
              local_428._8_8_ = local_618._8_8_;
              local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           **)(local_618 + 8);
              local_6d0._0_8_ = (pointer)0x0;
              local_6d0._8_8_ = &DAT_00000001;
              local_6d0._16_8_ = local_6b8;
              local_6b8[0]._M_local_buf[0] = '/';
              local_410 = &DAT_00000001;
              local_400 = 0;
              local_3f0 = (cmAlphaNum *)(this->Name)._M_dataplus._M_p;
              local_3f8 = (undefined8 *)(this->Name)._M_string_length;
              local_3e8 = 0;
              local_3e0 = 3;
              local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x8173e9;
              local_3d0 = 0;
              local_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_708._16_8_;
              local_408 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_6d0._16_8_;
              cmAlphaNum::cmAlphaNum(&local_518,iVar8);
              pcVar19 = (cmAlphaNum *)local_518.RValueString_;
              if ((cmAlphaNum *)local_518.RValueString_ == (cmAlphaNum *)0x0) {
                pcVar19 = (cmAlphaNum *)&local_518.View_._M_str;
              }
              local_3c8._8_8_ = pcVar19->RValueString_;
              pcVar19 = (cmAlphaNum *)local_518.RValueString_;
              if ((cmAlphaNum *)local_518.RValueString_ == (cmAlphaNum *)0x0) {
                pcVar19 = &local_518;
              }
              local_3c8._M_allocated_capacity = (pcVar19->View_)._M_len;
              local_3b8[0] = (cmAlphaNum *)local_518.RValueString_;
              local_4b0._M_dataplus._M_p = (pointer)0x0;
              local_4b0._M_string_length = (size_type)&DAT_00000001;
              local_4b0.field_2._M_allocated_capacity = (long)&local_4b0.field_2 + 8;
              local_4b0.field_2._M_local_buf[8] = '_';
              local_3b8[1] = (cmAlphaNum *)&DAT_00000001;
              local_3a8._8_8_ = 0;
              local_3a8._24_8_ = (pcVar18->Name)._M_dataplus._M_p;
              local_3a8._16_8_ = (pcVar18->Name)._M_string_length;
              local_388[0] = '\0';
              local_388[1] = '\0';
              local_388[2] = '\0';
              local_388[3] = '\0';
              local_388[4] = '\0';
              local_388[5] = '\0';
              local_388[6] = '\0';
              local_388[7] = '\0';
              local_380 = local_688;
              local_378 = local_690;
              local_370 = 0;
              views_01._M_len = 10;
              views_01._M_array = (iterator)&local_458;
              local_3a8._0_8_ = local_4b0.field_2._M_allocated_capacity;
              cmCatViews(&local_5a8,views_01);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_618._8_8_ != &local_600) {
                operator_delete((void *)local_618._8_8_,local_600._M_allocated_capacity + 1);
              }
              cmGeneratedFileStream::cmGeneratedFileStream
                        ((cmGeneratedFileStream *)&local_458,&local_5a8,false,None);
              cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&local_458,true);
              WriteCustomCommandsHelper
                        (this,(ostream *)&local_458,(cmCustomCommandGenerator *)local_190);
              this_04 = &local_458;
              cmGeneratedFileStream::Close((cmGeneratedFileStream *)&local_458);
              WriteCustomCommandLine
                        ((cmGhsMultiTargetGenerator *)this_04,(ostream *)fout,&local_5a8,
                         (cmCustomCommandGenerator *)local_190);
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_458);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                operator_delete(local_5a8._M_dataplus._M_p,
                                local_5a8.field_2._M_allocated_capacity + 1);
              }
              cmCustomCommandGenerator::~cmCustomCommandGenerator
                        ((cmCustomCommandGenerator *)local_190);
              ppcVar27 = ppcVar27 + 1;
              iVar8 = iVar8 + 1;
            } while (ppcVar27 != (pointer)local_618._0_8_);
          }
          if (local_690 != &local_680) {
            operator_delete(local_690,local_680._M_allocated_capacity + 1);
          }
        }
        if (this->TagType == CUSTOM_TARGET) {
          WriteBuildEvents(this,(ostream *)fout);
        }
        if (local_658.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_658.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_658.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_658.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                                *)&local_1d8,(key_type *)p_Var24);
        ppcVar25 = (pmVar12->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        local_618._0_8_ =
             (pmVar12->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (ppcVar25 != (pointer)local_618._0_8_) {
          do {
            this_01 = *ppcVar25;
            psVar9 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
            pcVar3 = (psVar9->_M_dataplus)._M_p;
            local_458._M_allocated_capacity = (size_type)(cmGeneratedFileStream *)local_448;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_458,pcVar3,pcVar3 + psVar9->_M_string_length);
            cmSystemTools::ConvertToOutputSlashes((string *)&local_458);
            local_190._0_8_ = local_190 + 0x10;
            local_190._8_8_ = (char *)0x0;
            local_190._16_8_ = local_190._16_8_ & 0xffffffffffffff00;
            bVar5 = this->TagType == CUSTOM_TARGET;
            if (bVar5) {
              cmSourceFile::GetLanguage_abi_cxx11_(&local_4d0,this_01);
              bVar29 = true;
              bVar6 = true;
              if (local_4d0._M_string_length == 0) goto LAB_003c03e6;
            }
            else {
LAB_003c03e6:
              pcVar16 = cmSourceFile::GetCustomCommand(this_01);
              bVar29 = pcVar16 != (cmCustomCommand *)0x0;
              bVar6 = bVar5;
            }
            if ((bVar6) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2)) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar29) {
              std::__cxx11::string::_M_replace((ulong)local_190,0,(char *)local_190._8_8_,0x81739d);
            }
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)fout,(char *)local_190._0_8_,local_190._8_8_);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(char *)local_458._M_allocated_capacity,local_458._8_8_);
            WriteObjectLangOverride_abi_cxx11_
                      ((string *)local_708,(cmGhsMultiTargetGenerator *)this_01,sourceFile);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(char *)local_708._0_8_,local_708._8_8_);
            local_6d0[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_6d0,1);
            pcVar1 = local_708 + 0x10;
            if ((char *)local_708._0_8_ != pcVar1) {
              operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
            }
            pcVar3 = local_6d0 + 0x10;
            if (!bVar29) {
              local_708._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_708,"INCLUDE_DIRECTORIES","");
              pcVar26 = (cmGhsMultiTargetGenerator *)local_6d0;
              local_6d0._0_8_ = pcVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"-I","");
              WriteSourceProperty(pcVar26,(ostream *)fout,this_01,(string *)local_708,
                                  (string *)local_6d0);
              if ((pointer)local_6d0._0_8_ != pcVar3) {
                operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
              }
              if ((char *)local_708._0_8_ != pcVar1) {
                operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
              }
              local_708._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_708,"COMPILE_DEFINITIONS","");
              pcVar26 = (cmGhsMultiTargetGenerator *)local_6d0;
              local_6d0._0_8_ = pcVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"-D","");
              WriteSourceProperty(pcVar26,(ostream *)fout,this_01,(string *)local_708,
                                  (string *)local_6d0);
              if ((pointer)local_6d0._0_8_ != pcVar3) {
                operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
              }
              if ((char *)local_708._0_8_ != pcVar1) {
                operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
              }
              local_708._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_708,"COMPILE_OPTIONS","");
              pcVar26 = (cmGhsMultiTargetGenerator *)local_6d0;
              local_6d0._0_8_ = pcVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"");
              WriteSourceProperty(pcVar26,(ostream *)fout,this_01,(string *)local_708,
                                  (string *)local_6d0);
              if ((pointer)local_6d0._0_8_ != pcVar3) {
                operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
              }
              if ((char *)local_708._0_8_ != pcVar1) {
                operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
              }
              psVar9 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_01);
              pcVar3 = (psVar9->_M_dataplus)._M_p;
              local_708._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_708,pcVar3,pcVar3 + psVar9->_M_string_length);
              if ((local_708._8_8_ != 0) &&
                 (bVar5 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_01),
                 bVar5)) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"    -o ",7);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)fout,(char *)local_708._0_8_,local_708._8_8_);
                local_6d0[0] = 10;
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_6d0,1);
              }
              if ((char *)local_708._0_8_ != pcVar1) {
                operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
              }
            }
            if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
              operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
            }
            if ((cmGeneratedFileStream *)local_458._M_allocated_capacity !=
                (cmGeneratedFileStream *)local_448) {
              operator_delete((void *)local_458._M_allocated_capacity,local_448._0_8_ + 1);
            }
            ppcVar25 = ppcVar25 + 1;
          } while (ppcVar25 != (pointer)local_618._0_8_);
        }
      }
      avVar21 = local_638;
      p_Var24 = local_4d8 + 1;
      iVar4._M_current = iStack_630._M_current;
    } while (local_4d8 + 1 != local_4e0);
  }
  for (; avVar21 !=
         (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])
         iVar4._M_current;
      avVar21 = (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])
                ((long)avVar21 + 8)) {
    cmGeneratedFileStream::Close(*(cmGeneratedFileStream **)avVar21);
  }
  if (local_638 != (vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>  [8])0x0)
  {
    operator_delete((void *)local_638,(long)local_628._M_p - (long)local_638);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_670);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_548);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_1a8);
  if (local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5c8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5c8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE").IsOn() ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}